

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNMeshBuilderMorton<4,_embree::QuadMesh,_embree::QuadMv<4>_>::build
          (BVHNMeshBuilderMorton<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this)

{
  size_t *psVar1;
  mvector<BVHBuilderMorton::BuildPrim> *morton;
  pointer ppTVar2;
  size_t sVar3;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar4;
  BuildPrim *pBVar5;
  uint uVar6;
  size_t i;
  long lVar7;
  BuildPrim *pBVar8;
  ulong uVar9;
  BVH *pBVar10;
  pointer ppTVar11;
  ulong numPrimitives;
  ulong uVar12;
  ulong uVar13;
  EVP_PKEY_CTX *ctx;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  BVHNodeRecord<embree::NodeRefPtr<4>_> root;
  
  uVar6 = (this->mesh->super_Geometry).numPrimitives;
  if (uVar6 != this->numPreviousPrimitives) {
    pBVar10 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar10->alloc);
    ppTVar2 = (pBVar10->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar11 = (pBVar10->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar11 != ppTVar2;
        ppTVar11 = ppTVar11 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar11,&pBVar10->alloc);
    }
    ppTVar11 = (pBVar10->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar10->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
      (pBVar10->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar11;
    }
    LOCK();
    (pBVar10->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar10->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar10->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar10->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar10->alloc).usedBlocks._M_b._M_p,(pBVar10->alloc).device,
                 (pBVar10->alloc).useUSM);
    }
    LOCK();
    (pBVar10->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar10->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar10->alloc).freeBlocks._M_b._M_p,(pBVar10->alloc).device,
                 (pBVar10->alloc).useUSM);
    }
    LOCK();
    (pBVar10->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    for (lVar7 = -0x40; lVar7 != 0; lVar7 = lVar7 + 8) {
      LOCK();
      *(undefined8 *)((long)&(pBVar10->alloc).threadBlocks[0]._M_b._M_p + lVar7) = 0;
      UNLOCK();
      LOCK();
      *(undefined8 *)((long)&(pBVar10->alloc).threadBlocks[8]._M_b._M_p + lVar7) = 0;
      UNLOCK();
    }
    sVar3 = (pBVar10->alloc).primrefarray.size_alloced;
    ptr = (pBVar10->alloc).primrefarray.items;
    if (ptr != (PrimRef *)0x0) {
      if (sVar3 << 5 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar3 << 5,(pBVar10->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar3 != 0) {
      pMVar4 = (pBVar10->alloc).primrefarray.alloc.device;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar3 * -0x20,1);
    }
    (pBVar10->alloc).primrefarray.items = (PrimRef *)0x0;
    (pBVar10->alloc).primrefarray.size_active = 0;
    (pBVar10->alloc).primrefarray.size_alloced = 0;
    sVar3 = (this->morton).size_alloced;
    pBVar5 = (this->morton).items;
    if (pBVar5 != (BuildPrim *)0x0) {
      if (sVar3 * 8 < 0x1c00000) {
        alignedFree(pBVar5);
      }
      else {
        os_free(pBVar5,sVar3 * 8,(this->morton).alloc.hugepages);
      }
    }
    if (sVar3 != 0) {
      pMVar4 = (this->morton).alloc.device;
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar3 * -8,1);
    }
    (this->morton).items = (BuildPrim *)0x0;
    (this->morton).size_active = 0;
    (this->morton).size_alloced = 0;
    uVar6 = (this->mesh->super_Geometry).numPrimitives;
  }
  this->numPreviousPrimitives = uVar6;
  if (uVar6 == 0) {
    local_a8._0_8_ = 0x7f8000007f800000;
    local_a8._8_8_ = 0x7f8000007f800000;
    local_98 = 0xff800000ff800000;
    uStack_90 = 0xff800000ff800000;
    local_88 = 0x7f8000007f800000;
    uStack_80 = 0x7f8000007f800000;
    local_78 = 0xff800000ff800000;
    uStack_70 = 0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&local_a8.field_1,0);
    return;
  }
  numPrimitives = (ulong)uVar6;
  uVar9 = (this->morton).size_alloced;
  uVar13 = uVar9;
  if ((uVar9 < numPrimitives) && (uVar12 = uVar9, uVar13 = numPrimitives, uVar9 != 0)) {
    for (; uVar13 = uVar12, uVar12 < numPrimitives; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0))
    {
    }
  }
  psVar1 = &(this->morton).size_active;
  if (numPrimitives < (this->morton).size_active) {
    *psVar1 = numPrimitives;
  }
  morton = &this->morton;
  if (uVar9 == uVar13) {
    *psVar1 = numPrimitives;
    goto LAB_00e0aa4d;
  }
  pBVar5 = (this->morton).items;
  if (uVar13 == 0) {
    uVar9 = 0;
LAB_00e0a9c9:
    pBVar8 = (BuildPrim *)alignedMalloc(uVar9,8);
  }
  else {
    pMVar4 = (morton->alloc).device;
    uVar9 = uVar13 * 8;
    (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,uVar9,0);
    if (uVar9 < 0x1c00000) goto LAB_00e0a9c9;
    pBVar8 = (BuildPrim *)os_malloc(uVar9,&(this->morton).alloc.hugepages);
  }
  (this->morton).items = pBVar8;
  for (uVar9 = 0; uVar9 < *psVar1; uVar9 = uVar9 + 1) {
    (this->morton).items[uVar9].field_0 = pBVar5[uVar9].field_0;
  }
  sVar3 = (this->morton).size_alloced;
  if (pBVar5 != (BuildPrim *)0x0) {
    if (sVar3 * 8 < 0x1c00000) {
      alignedFree(pBVar5);
    }
    else {
      os_free(pBVar5,sVar3 * 8,(this->morton).alloc.hugepages);
    }
  }
  if (sVar3 != 0) {
    pMVar4 = (morton->alloc).device;
    (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,sVar3 * -8,1);
  }
  (this->morton).size_active = numPrimitives;
  (this->morton).size_alloced = uVar13;
LAB_00e0aa4d:
  FastAllocator::init(&this->bvh->alloc,(EVP_PKEY_CTX *)(numPrimitives * 8));
  createMortonCodeArray<embree::QuadMesh>
            (this->mesh,morton,&(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  BVHBuilderMorton::
  build<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::avx::SetBVHNBounds<4>,embree::avx::CreateMortonLeaf<4,embree::QuadMv<4>>,embree::avx::CalculateMeshBounds<embree::QuadMesh>,embree::Scene::BuildProgressMonitorInterface>
            (&root,(BVHBuilderMorton *)&this->bvh->alloc);
  local_a8._0_8_ = root.bounds.lower.field_0._0_8_;
  local_a8._8_8_ = root.bounds.lower.field_0._8_8_;
  local_98 = root.bounds.upper.field_0._0_8_;
  uStack_90 = root.bounds.upper.field_0._8_8_;
  local_88 = root.bounds.lower.field_0._0_8_;
  uStack_80 = root.bounds.lower.field_0._8_8_;
  local_78 = root.bounds.upper.field_0._0_8_;
  uStack_70 = root.bounds.upper.field_0._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ref.ptr,(LBBox3fa *)&local_a8.field_1,numPrimitives);
  BVHNRotate<4>::rotate((NodeRef)(this->bvh->root).ptr,1);
  ctx = (EVP_PKEY_CTX *)&this->bvh->root;
  BVHN<4>::clearBarrier(this->bvh,(NodeRef *)ctx);
  pBVar10 = this->bvh;
  if ((pBVar10->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
    sVar3 = (this->morton).size_alloced;
    pBVar5 = (this->morton).items;
    if (pBVar5 != (BuildPrim *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar3 * 8);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pBVar5);
      }
      else {
        os_free(pBVar5,(size_t)ctx,(this->morton).alloc.hugepages);
      }
    }
    if (sVar3 != 0) {
      pMVar4 = (morton->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar3 * -8);
      (**pMVar4->_vptr_MemoryMonitorInterface)(pMVar4,ctx,1);
    }
    *psVar1 = 0;
    (this->morton).size_alloced = 0;
    (this->morton).items = (BuildPrim *)0x0;
    pBVar10 = this->bvh;
  }
  BVHN<4>::cleanup(pBVar10,ctx);
  return;
}

Assistant:

void build() 
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
          morton.clear();
        }
        size_t numPrimitives = mesh->size();
        numPreviousPrimitives = numPrimitives;
        
        /* skip build for empty scene */
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
        
        /* preallocate arrays */
        morton.resize(numPrimitives);
        size_t bytesEstimated = numPrimitives*sizeof(AABBNode)/(4*N) + size_t(1.2f*Primitive::blocks(numPrimitives)*sizeof(Primitive));
        size_t bytesMortonCodes = numPrimitives*sizeof(BVHBuilderMorton::BuildPrim);
        bytesEstimated = max(bytesEstimated,bytesMortonCodes); // the first allocation block is reused to sort the morton codes
        bvh->alloc.init(bytesMortonCodes,bytesMortonCodes,bytesEstimated);

        /* create morton code array */
        BVHBuilderMorton::BuildPrim* dest = (BVHBuilderMorton::BuildPrim*) bvh->alloc.specialAlloc(bytesMortonCodes);
        size_t numPrimitivesGen = createMortonCodeArray<Mesh>(mesh,morton,bvh->scene->progressInterface);

        /* create BVH */
        SetBVHNBounds<N> setBounds(bvh);
        CreateMortonLeaf<N,Primitive> createLeaf(mesh,geomID_,morton.data());
        CalculateMeshBounds<Mesh> calculateBounds(mesh);
        auto root = BVHBuilderMorton::build<NodeRecord>(
          typename BVH::CreateAlloc(bvh), 
          typename BVH::AABBNode::Create(),
          setBounds,createLeaf,calculateBounds,bvh->scene->progressInterface,
          morton.data(),dest,numPrimitivesGen,settings);
        
        bvh->set(root.ref,LBBox3fa(root.bounds),numPrimitives);
        
#if ROTATE_TREE
        if (N == 4)
        {
          for (int i=0; i<ROTATE_TREE; i++)
            BVHNRotate<N>::rotate(bvh->root);
          bvh->clearBarrier(bvh->root);
        }
#endif

        /* clear temporary data for static geometry */
        if (bvh->scene->isStaticAccel()) {
          morton.clear();
        }
        bvh->cleanup();
      }